

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

int create_send_pending_events_state
              (TELEMETRY_MESSENGER_INSTANCE_conflict *instance,
              SEND_PENDING_EVENTS_STATE *send_pending_events_state)

{
  int iVar1;
  MESSAGE_HANDLE message;
  LOGGER_LOG p_Var2;
  MESSENGER_SEND_EVENT_TASK *task;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LIST_ITEM_HANDLE pLVar4;
  int iVar5;
  char *pcVar6;
  
  send_pending_events_state->task = (MESSENGER_SEND_EVENT_TASK *)0x0;
  send_pending_events_state->message_batch_container = (MESSAGE_HANDLE)0x0;
  send_pending_events_state->bytes_pending = 0;
  message = message_create();
  send_pending_events_state->message_batch_container = message;
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x443;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x443;
    }
    pcVar6 = "messageBatchContainer = message_create() failed";
    iVar5 = 0x442;
    goto LAB_001370bb;
  }
  iVar1 = message_set_message_format(message,0x80013700);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x448;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x448;
    }
    pcVar6 = "Failed setting the message format to batching format";
    iVar5 = 0x447;
    goto LAB_001370bb;
  }
  task = (MESSENGER_SEND_EVENT_TASK *)calloc(1,0x20);
  if (task == (MESSENGER_SEND_EVENT_TASK *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_task",0x3a2,1,"malloc of MESSENGER_SEND_EVENT_TASK failed");
    }
  }
  else {
    task->messenger = instance;
    task->send_time = -1;
    pSVar3 = singlylinkedlist_create();
    task->callback_list = pSVar3;
    if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar6 = "singlylinkedlist_create failed to create callback_list";
        iVar1 = 0x3ab;
        goto LAB_00137078;
      }
    }
    else {
      pLVar4 = singlylinkedlist_add(instance->in_progress_list,task);
      if (pLVar4 != (LIST_ITEM_HANDLE)0x0) {
        send_pending_events_state->task = task;
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"move_event_to_in_progress_list",0x2ed,1,
                  "Failed moving event to in_progress list (singlylinkedlist_add failed)");
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar6 = "move_event_to_in_progress_list failed";
        iVar1 = 0x3b1;
LAB_00137078:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"create_task",iVar1,1,pcVar6);
      }
    }
    free_task(task);
  }
  send_pending_events_state->task = (MESSENGER_SEND_EVENT_TASK *)0x0;
  p_Var2 = xlogging_get_log_function();
  iVar1 = 0x44d;
  if (p_Var2 == (LOGGER_LOG)0x0) {
    return 0x44d;
  }
  pcVar6 = "create_task() failed";
  iVar5 = 0x44c;
LAB_001370bb:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
            ,"create_send_pending_events_state",iVar5,1,pcVar6);
  return iVar1;
}

Assistant:

static int create_send_pending_events_state(TELEMETRY_MESSENGER_INSTANCE* instance, SEND_PENDING_EVENTS_STATE *send_pending_events_state)
{
    int result;
    memset(send_pending_events_state, 0, sizeof(*send_pending_events_state));

    if ((send_pending_events_state->message_batch_container = message_create()) == NULL)
    {
        LogError("messageBatchContainer = message_create() failed");
        result = MU_FAILURE;
    }
    else if (message_set_message_format(send_pending_events_state->message_batch_container, AMQP_BATCHING_FORMAT_CODE) != 0)
    {
         LogError("Failed setting the message format to batching format");
         result = MU_FAILURE;
    }
    else if ((send_pending_events_state->task = create_task(instance)) == NULL)
    {
        LogError("create_task() failed");
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}